

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_resp_make(http_resp **presp,int status,char *description)

{
  http_resp *resp;
  char *pcVar1;
  CURLcode CVar2;
  
  resp = (http_resp *)(*Curl_ccalloc)(1,0x88);
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (resp == (http_resp *)0x0) {
LAB_001350a5:
    resp = (http_resp *)0x0;
  }
  else {
    resp->status = status;
    if (description != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(description);
      resp->description = pcVar1;
      if (pcVar1 == (char *)0x0) {
        Curl_http_resp_free(resp);
        goto LAB_001350a5;
      }
    }
    CVar2 = CURLE_OK;
    Curl_dynhds_init(&resp->headers,0,0x100000);
    Curl_dynhds_init(&resp->trailers,0,0x100000);
  }
  *presp = resp;
  return CVar2;
}

Assistant:

CURLcode Curl_http_resp_make(struct http_resp **presp,
                             int status,
                             const char *description)
{
  struct http_resp *resp;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  resp = calloc(1, sizeof(*resp));
  if(!resp)
    goto out;

  resp->status = status;
  if(description) {
    resp->description = strdup(description);
    if(!resp->description)
      goto out;
  }
  Curl_dynhds_init(&resp->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&resp->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && resp)
    Curl_http_resp_free(resp);
  *presp = result ? NULL : resp;
  return result;
}